

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

int cmsys::regtry(char *string,char **start,char **end,char *prog)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  uVar1 = 0xb;
  lVar3 = 0;
  reginput = string;
  regstartp = start;
  regendp = end;
  do {
    *(undefined8 *)((long)start + lVar3) = 0;
    *(undefined8 *)((long)end + lVar3) = 0;
    lVar3 = lVar3 + 8;
    uVar1 = uVar1 - 1;
  } while (1 < uVar1);
  iVar2 = regmatch(prog + 1);
  if (iVar2 != 0) {
    *start = string;
    *end = reginput;
  }
  return (uint)(iVar2 != 0);
}

Assistant:

static int regtry(const char* string, const char** start, const char** end,
                  const char* prog)
{
  int i;
  const char** sp1;
  const char** ep;

  reginput = string;
  regstartp = start;
  regendp = end;

  sp1 = start;
  ep = end;
  for (i = RegularExpression::NSUBEXP; i > 0; i--) {
    *sp1++ = 0;
    *ep++ = 0;
  }
  if (regmatch(prog + 1)) {
    start[0] = string;
    end[0] = reginput;
    return (1);
  } else
    return (0);
}